

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

void kv_get_nth_splitter_test(void)

{
  size_t sVar1;
  undefined1 auStackY_188 [8];
  btree_kv_ops *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffe88;
  void **in_stack_fffffffffffffe90;
  void *local_108;
  undefined4 in_stack_ffffffffffffff00;
  uint16_t in_stack_ffffffffffffff04;
  uint8_t in_stack_ffffffffffffff06;
  uint8_t in_stack_ffffffffffffff07;
  key_len_t in_stack_ffffffffffffff0e;
  char *in_stack_ffffffffffffff10;
  int local_cc;
  int i;
  void **key_ptrs;
  char *pcStack_b8;
  int n;
  char *keys [6];
  void *local_80;
  void *key;
  ushort local_6e;
  int cmp;
  idx_t idx;
  uint8_t v;
  uint8_t vsize;
  undefined1 *puStack_68;
  uint8_t ksize;
  btree_kv_ops *kv_ops;
  bnoderef node;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  keys[3] = "123231234242423428492342";
  keys[4] = "string with space";
  keys[1] = "longerstring";
  keys[2] = "";
  pcStack_b8 = "string";
  keys[0] = "longstring";
  for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
    strlen(keys[(long)local_cc + -1]);
    construct_key_ptr(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0e,
                      (void *)CONCAT17(in_stack_ffffffffffffff07,
                                       CONCAT16(in_stack_ffffffffffffff06,
                                                CONCAT24(in_stack_ffffffffffffff04,
                                                         in_stack_ffffffffffffff00))));
  }
  sVar1 = strlen(pcStack_b8);
  cmp._3_1_ = (char)sVar1 + 3;
  cmp._2_1_ = 1;
  kv_ops = (btree_kv_ops *)
           dummy_node(in_stack_ffffffffffffff07,in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)
  ;
  *(idx_t *)((long)&kv_ops->get_kv + 6) = 6;
  cmp._1_1_ = 'd';
  puStack_68 = auStackY_188;
  btree_str_kv_get_kb64_vb64(in_stack_fffffffffffffe80);
  for (local_6e = 0; local_6e < 6; local_6e = local_6e + 1) {
    (**(code **)(puStack_68 + 8))(kv_ops,local_6e,&local_108 + local_6e);
    cmp._1_1_ = cmp._1_1_ + '\x01';
  }
  local_80 = (void *)0x0;
  (**(code **)(puStack_68 + 0x58))(0,kv_ops,&local_80);
  key._4_4_ = memcmp(local_80,local_108,(ulong)cmp._3_1_);
  if (key._4_4_ != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x48f);
    kv_get_nth_splitter_test::__test_pass = 0;
    if (key._4_4_ != 0) {
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x48f,"void kv_get_nth_splitter_test()");
    }
  }
  free(kv_ops);
  free(local_80);
  freevars(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  memleak_end();
  if (kv_get_nth_splitter_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_get_nth_splitter_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_get_nth_splitter_test");
  }
  return;
}

Assistant:

void kv_get_nth_splitter_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp;
    void *key;

    const char *keys[] = {"string",
                          "longstring",
                          "longerstring",
                          "",
                          "123231234242423428492342",
                          "string with space"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (int i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // set n keys
    for (idx = 0; idx < n; idx ++){
        kv_ops->set_kv(node, idx, &key_ptrs[idx], (void *)&v);
        v++;
    }

    // set *key to nth_splitter
    key = NULL;
    kv_ops->get_nth_splitter(NULL, node, &key);

    // verify key[0] is set as splitter
    cmp = memcmp(key, key_ptrs[0], ksize);
    TEST_CHK(cmp == 0);

    free(node);
    free(key);
    freevars(key_ptrs, n);
    memleak_end();
    TEST_RESULT("kv_get_nth_splitter_test");
}